

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeEnterAll(sqlite3 *db)

{
  Btree *p_00;
  u8 uVar1;
  Btree *p;
  int skipOk;
  int i;
  sqlite3 *db_local;
  
  uVar1 = '\x01';
  for (p._4_4_ = 0; p._4_4_ < db->nDb; p._4_4_ = p._4_4_ + 1) {
    p_00 = db->aDb[p._4_4_].pBt;
    if ((p_00 != (Btree *)0x0) && (p_00->sharable != '\0')) {
      sqlite3BtreeEnter(p_00);
      uVar1 = '\0';
    }
  }
  db->noSharedCache = uVar1;
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeEnterAll(sqlite3 *db){
  int i;
  int skipOk = 1;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p && p->sharable ){
      sqlite3BtreeEnter(p);
      skipOk = 0;
    }
  }
  db->noSharedCache = skipOk;
}